

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

void __thiscall
duckdb::ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_>::ModeState
          (ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_> *this)

{
  DataChunk *in_RDI;
  DataChunk *this_00;
  
  this_00 = in_RDI;
  vector<duckdb::FrameBounds,_true>::vector((vector<duckdb::FrameBounds,_true> *)0x1e1bcbf);
  this_00->count = 0;
  this_00->capacity = 0;
  (this_00->vector_caches).super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
  super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined1 *)
   &(this_00->vector_caches).super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
    .super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  (this_00->vector_caches).super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
  super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00[1].data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  DataChunk::DataChunk(this_00);
  in_RDI[2].data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_RDI[2].count = 0;
  return;
}

Assistant:

ModeState() {
	}